

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

void __thiscall HighsMipSolverData::runSetup(HighsMipSolverData *this)

{
  long lVar1;
  HighsVarType HVar2;
  bool bVar3;
  HighsInt HVar4;
  uint uVar5;
  uint uVar6;
  undefined4 uVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  reference pvVar10;
  double *pdVar11;
  reference pvVar12;
  byte *pbVar13;
  reference piVar14;
  logic_error *this_00;
  size_type sVar15;
  size_type sVar16;
  uint uVar17;
  undefined4 uVar18;
  char *pcVar19;
  HighsLogOptions *log_options_;
  int iVar20;
  long *in_RDI;
  vector<double,_std::allocator<double>_> *this_01;
  bool bound_change_2;
  double prev_lower_bound_1;
  HighsInt i_2;
  HighsInt numBin;
  HighsInt col;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  bool bound_change_1;
  double prev_lower_bound;
  HighsInt j_1;
  bool integral;
  HighsInt end_1;
  HighsInt start_1;
  double maxabsval;
  HighsInt i_1;
  HighsInt row;
  HighsInt j;
  HighsInt end;
  HighsInt start;
  HighsInt i;
  bool interrupt;
  double new_upper_limit;
  bool bound_change;
  double prev_upper_bound;
  bool feasible;
  double solobj;
  HighsLp *model;
  HighsPseudocost *in_stack_fffffffffffffb88;
  undefined4 uVar21;
  HighsMipSolverData *in_stack_fffffffffffffb90;
  undefined4 uVar22;
  HighsSymmetries *this_02;
  undefined4 in_stack_fffffffffffffb98;
  HighsInt in_stack_fffffffffffffb9c;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  size_type in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  HighsInt in_stack_fffffffffffffbbc;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  double in_stack_fffffffffffffbe8;
  int64_t in_stack_fffffffffffffbf0;
  double dVar23;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc10;
  HighsMipSolverData *in_stack_fffffffffffffc18;
  allocator *paVar24;
  HighsMipSolverData *in_stack_fffffffffffffc20;
  double in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  byte in_stack_fffffffffffffc37;
  string *in_stack_fffffffffffffc38;
  string *in_stack_fffffffffffffc40;
  Highs *in_stack_fffffffffffffc48;
  HighsCliqueTable *in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  double in_stack_fffffffffffffc60;
  HighsObjectiveFunction *this_03;
  undefined8 *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  byte in_stack_fffffffffffffc77;
  bool local_372;
  bool local_371;
  double local_368;
  double local_360;
  HighsCDouble local_358;
  undefined1 local_341;
  double local_340;
  int local_334;
  uint local_330;
  allocator local_329;
  string local_328 [39];
  allocator local_301;
  string local_300 [36];
  int local_2dc;
  int *local_2d8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_2d0;
  vector<int,_std::allocator<int>_> *local_2c8;
  HighsCDouble local_2c0;
  undefined1 local_2a9;
  double local_2a8;
  double local_2a0;
  value_type local_298;
  byte local_291;
  int local_290;
  value_type local_28c;
  string *local_288;
  int local_280;
  int local_27c;
  value_type local_278;
  int local_274;
  value_type local_270;
  int local_26c;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  HighsPseudocost *in_stack_fffffffffffffda0;
  HighsDomain *in_stack_fffffffffffffe28;
  undefined1 local_f8 [48];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  allocator local_91;
  string local_90 [39];
  byte local_69;
  reference local_68;
  double local_58;
  undefined1 local_49;
  double local_48;
  bool local_39;
  double local_38;
  int *local_18;
  
  local_18 = *(int **)(*in_RDI + 0x10);
  in_RDI[0xce4] = -0x10000000000000;
  in_RDI[0xce3] = 0;
  in_RDI[0xcf9] = (long)((double)in_RDI[0xcf9] - *(double *)(*(long *)(*in_RDI + 0x10) + 0xf8));
  in_RDI[0xcfa] = (long)((double)in_RDI[0xcfa] - *(double *)(*(long *)(*in_RDI + 0x10) + 0xf8));
  in_RDI[0xcf7] = (long)((double)in_RDI[0xcf7] - *(double *)(*(long *)(*in_RDI + 0x10) + 0xf8));
  in_RDI[0xcf8] = (long)((double)in_RDI[0xcf8] - *(double *)(*(long *)(*in_RDI + 0x10) + 0xf8));
  if ((*(double *)(*in_RDI + 0x40) != INFINITY) || (NAN(*(double *)(*in_RDI + 0x40)))) {
    presolve::HighsPostsolveStack::getReducedPrimalSolution
              ((HighsPostsolveStack *)in_stack_fffffffffffffc48,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc40);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
    local_38 = *(double *)(*in_RDI + 0x40) * (double)*(int *)(*(long *)(*in_RDI + 0x18) + 0xf0) +
               -*(double *)(*(long *)(*in_RDI + 0x10) + 0xf8);
    local_371 = false;
    if ((*(double *)(*in_RDI + 0x48) <= *(double *)(*(long *)(*in_RDI + 8) + 0x328)) &&
       (local_371 = false,
       *(double *)(*in_RDI + 0x50) <= *(double *)(*(long *)(*in_RDI + 8) + 0x328))) {
      local_371 = *(double *)(*in_RDI + 0x58) <= *(double *)(*(long *)(*in_RDI + 8) + 0x328);
    }
    local_39 = local_371;
    if (*(int *)((long)in_RDI + 0x641c) == 0) {
      pcVar19 = "infeasible";
      if (local_371 != false) {
        pcVar19 = "feasible";
      }
      highsLogUser((int)*(undefined8 *)(*in_RDI + 0x40),
                   (HighsLogType)(*(long *)(*in_RDI + 8) + 0x380),(char *)0x1,
                   "\nMIP start solution is %s, objective value is %.12g\n",pcVar19);
    }
    if (((local_39 & 1U) != 0) && (local_38 < (double)in_RDI[0xcf8])) {
      local_48 = (double)in_RDI[0xcf8];
      in_RDI[0xcf8] = (long)local_38;
      local_49 = (double)in_RDI[0xcf8] != local_48;
      if (((*(byte *)(*in_RDI + 0xb0) & 1) == 0) && ((bool)local_49)) {
        updatePrimalDualIntegral
                  ((HighsMipSolverData *)
                   CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                   (double)in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                   (double)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                   (double)in_stack_fffffffffffffc50,
                   SUB81((ulong)in_stack_fffffffffffffc48 >> 0x38,0),
                   SUB81((ulong)in_stack_fffffffffffffc48 >> 0x30,0));
      }
      local_58 = computeNewUpperLimit
                           (in_stack_fffffffffffffc20,(double)in_stack_fffffffffffffc18,
                            (double)in_stack_fffffffffffffc10,
                            (double)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      saveReportMipSolution
                ((HighsMipSolverData *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30)
                 ,in_stack_fffffffffffffc28);
      if (local_58 < (double)in_RDI[0xcf9]) {
        in_RDI[0xcf9] = (long)local_58;
        dVar23 = computeNewUpperLimit
                           (in_stack_fffffffffffffc20,(double)in_stack_fffffffffffffc18,
                            (double)in_stack_fffffffffffffc10,
                            (double)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        in_RDI[0xcfa] = (long)dVar23;
        HighsNodeQueue::setOptimalityLimit((HighsNodeQueue *)(in_RDI + 0xcfe),(double)in_RDI[0xcfa])
        ;
      }
    }
    local_372 = false;
    if (((*(byte *)(*in_RDI + 0xb0) & 1) == 0) && (local_372 = false, (local_39 & 1U) != 0)) {
      bVar3 = std::function::operator_cast_to_bool
                        ((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
                          *)in_stack_fffffffffffffb90);
      local_372 = false;
      if (bVar3) {
        local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)
                              CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                              in_stack_fffffffffffffba8);
        local_372 = std::_Bit_reference::operator_cast_to_bool(&local_68);
      }
    }
    if (local_372 != false) {
      HighsCallback::clearHighsCallbackDataOut(*(HighsCallback **)*in_RDI);
      pdVar11 = std::vector<double,_std::allocator<double>_>::data
                          ((vector<double,_std::allocator<double>_> *)0x6252a7);
      *(double **)(*(long *)*in_RDI + 0xa8) = pdVar11;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"Feasible solution",&local_91);
      in_stack_fffffffffffffc77 =
           interruptFromCallbackWithData
                     ((HighsMipSolverData *)
                      CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                      (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20),in_stack_fffffffffffffbe8,
                      (string *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      local_69 = in_stack_fffffffffffffc77 & 1;
    }
  }
  HVar4 = HighsMipSolver::numCol((HighsMipSolver *)*in_RDI);
  if (HVar4 == 0) {
    local_c8 = 0;
    uStack_c0 = 0;
    local_b8 = 0;
    in_stack_fffffffffffffc68 = &local_c8;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x6253eb);
    addIncumbent(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                 (double)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                 (int)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffc00 >> 0x18,0),
                 SUB81((ulong)in_stack_fffffffffffffc00 >> 0x10,0));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
  }
  memset(local_f8,0,0x30);
  HighsRedcostFixing::HighsRedcostFixing((HighsRedcostFixing *)in_stack_fffffffffffffb90);
  HighsRedcostFixing::operator=
            ((HighsRedcostFixing *)in_stack_fffffffffffffb90,
             (HighsRedcostFixing *)in_stack_fffffffffffffb88);
  HighsRedcostFixing::~HighsRedcostFixing((HighsRedcostFixing *)in_stack_fffffffffffffb90);
  HighsPseudocost::HighsPseudocost
            (in_stack_fffffffffffffda0,
             (HighsMipSolver *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  HighsPseudocost::operator=((HighsPseudocost *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88)
  ;
  HighsPseudocost::~HighsPseudocost((HighsPseudocost *)in_stack_fffffffffffffb90);
  this_03 = (HighsObjectiveFunction *)(in_RDI + 0xcfe);
  HighsMipSolver::numCol((HighsMipSolver *)*in_RDI);
  HighsNodeQueue::setNumCol
            ((HighsNodeQueue *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbbc);
  HighsNodeQueue::setOptimalityLimit((HighsNodeQueue *)(in_RDI + 0xcfe),(double)in_RDI[0xcfa]);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x625536);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x62554a);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x62555e);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x625572);
  *(undefined1 *)((long)in_RDI + 0x6411) = 0;
  if ((*(byte *)((long)in_RDI + 0x6411) & 1) == 0) {
    *(undefined1 *)((long)in_RDI + 0x6411) = 1;
    in_stack_fffffffffffffb88 = (HighsPseudocost *)(in_RDI + 0xc89);
    in_stack_fffffffffffffb90 = (HighsMipSolverData *)(in_RDI + 0xc8c);
    highsSparseTranspose
              ((HighsInt)((ulong)in_stack_fffffffffffffc20 >> 0x20),
               (HighsInt)in_stack_fffffffffffffc20,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc18,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc10,
               (vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               in_stack_fffffffffffffc00,
               (vector<int,_std::allocator<int>_> *)
               CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc38);
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb90,
               (size_type)in_stack_fffffffffffffb88,(value_type_conflict2 *)0x625645);
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb90,
               (size_type)in_stack_fffffffffffffb88,(value_type_conflict2 *)0x625677);
    for (local_26c = 0; local_26c != *local_18; local_26c = local_26c + 1) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_18 + 0x24),(long)local_26c);
      local_270 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_18 + 0x24),
                          (long)(local_26c + 1));
      local_274 = *pvVar8;
      for (local_278 = local_270; local_278 != local_274; local_278 = local_278 + 1) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_18 + 0x30),(long)local_278);
        local_27c = *pvVar8;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x14),
                            (long)local_27c);
        if ((*pvVar9 != -INFINITY) || (NAN(*pvVar9))) {
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 0x36),
                              (long)local_278);
          if (0.0 < *pvVar9 || *pvVar9 == 0.0) {
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc98),
                                 (long)local_26c);
            *pvVar10 = *pvVar10 + 1;
          }
          else {
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc95),
                                 (long)local_26c);
            *pvVar10 = *pvVar10 + 1;
          }
        }
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x1a),
                            (long)local_27c);
        if ((*pvVar9 != INFINITY) || (NAN(*pvVar9))) {
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 0x36),
                              (long)local_278);
          if (0.0 < *pvVar9 || *pvVar9 == 0.0) {
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc95),
                                 (long)local_26c);
            *pvVar10 = *pvVar10 + 1;
          }
          else {
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc98),
                                 (long)local_26c);
            *pvVar10 = *pvVar10 + 1;
          }
        }
      }
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),in_stack_fffffffffffffba8
            );
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),in_stack_fffffffffffffba8
            );
  for (local_280 = 0; local_280 != *(int *)(*(long *)(*in_RDI + 0x10) + 4);
      local_280 = local_280 + 1) {
    local_288 = (string *)0x0;
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc86),(long)local_280);
    local_28c = *pvVar10;
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc86),(long)(local_280 + 1)
                        );
    local_290 = *pvVar10;
    local_291 = 1;
    for (local_298 = local_28c; local_298 != local_290; local_298 = local_298 + 1) {
      in_stack_fffffffffffffc5f = false;
      if ((local_291 & 1) != 0) {
        in_stack_fffffffffffffc50 = (HighsCliqueTable *)*in_RDI;
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc89),(long)local_298);
        HVar2 = HighsMipSolver::variableType
                          ((HighsMipSolver *)in_stack_fffffffffffffb90,
                           (HighsInt)((ulong)in_stack_fffffffffffffb88 >> 0x20));
        in_stack_fffffffffffffc5f = false;
        if (HVar2 != kContinuous) {
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc8c),(long)local_298);
          dVar23 = fractionality<double>
                             ((double)in_stack_fffffffffffffb90,(double *)in_stack_fffffffffffffb88)
          ;
          in_stack_fffffffffffffc5f = dVar23 <= (double)in_RDI[0xcc5];
        }
      }
      this_01 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0xc8c);
      local_291 = in_stack_fffffffffffffc5f;
      std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)local_298);
      std::abs((int)this_01);
      pdVar11 = std::max<double>((double *)&local_288,&local_2a0);
      local_288 = (string *)*pdVar11;
    }
    if ((local_291 & 1) != 0) {
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc19),
                           (long)local_280);
      if ((*pvVar12 != -INFINITY) || (NAN(*pvVar12))) {
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc19),
                             (long)local_280);
        in_stack_fffffffffffffc48 = (Highs *)ceil(*pvVar12 - (double)in_RDI[0xcc4]);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc19),
                             (long)local_280);
        *pvVar12 = (value_type)in_stack_fffffffffffffc48;
      }
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc1c),
                           (long)local_280);
      if ((*pvVar12 != INFINITY) || (NAN(*pvVar12))) {
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc1c),
                             (long)local_280);
        in_stack_fffffffffffffc40 = (string *)floor(*pvVar12 + (double)in_RDI[0xcc4]);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc1c),
                             (long)local_280);
        *pvVar12 = (value_type)in_stack_fffffffffffffc40;
      }
    }
    in_stack_fffffffffffffc37 = local_291 & 1;
    pbVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xc92),
                         (long)local_280);
    *pbVar13 = in_stack_fffffffffffffc37;
    in_stack_fffffffffffffc38 = local_288;
    pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc8f),(long)local_280
                        );
    *pvVar12 = (value_type)in_stack_fffffffffffffc38;
  }
  HighsObjectiveFunction::setupCliquePartition
            (this_03,(HighsDomain *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
             in_stack_fffffffffffffc50);
  HighsDomain::setupObjectivePropagation
            ((HighsDomain *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
  HighsDomain::computeRowActivities((HighsDomain *)in_stack_fffffffffffffc20);
  HighsDomain::propagate(in_stack_fffffffffffffe28);
  bVar3 = HighsDomain::infeasible((HighsDomain *)(in_RDI + 0x72));
  if (bVar3) {
    *(undefined4 *)(*in_RDI + 0x20) = 8;
    local_2a8 = (double)in_RDI[0xcf7];
    in_RDI[0xcf7] = 0x7ff0000000000000;
    local_2a9 = (double)in_RDI[0xcf7] != local_2a8;
    if (((*(byte *)(*in_RDI + 0xb0) & 1) == 0) && ((bool)local_2a9)) {
      updatePrimalDualIntegral
                ((HighsMipSolverData *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70)
                 ,(double)in_stack_fffffffffffffc68,(double)this_03,
                 (double)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                 (double)in_stack_fffffffffffffc50,SUB81((ulong)in_stack_fffffffffffffc48 >> 0x38,0)
                 ,SUB81((ulong)in_stack_fffffffffffffc48 >> 0x30,0));
    }
    HighsCDouble::HighsCDouble(&local_2c0,1.0);
    in_RDI[0xce0] = (long)local_2c0.hi;
    in_RDI[0xce1] = (long)local_2c0.lo;
  }
  else if (*local_18 == 0) {
    *(undefined4 *)(*in_RDI + 0x20) = 7;
  }
  else {
    bVar3 = checkLimits((HighsMipSolverData *)
                        CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                        in_stack_fffffffffffffbf0);
    if (!bVar3) {
      local_2c8 = HighsDomain::getChangedCols((HighsDomain *)(in_RDI + 0x72));
      local_2d0._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb88);
      local_2d8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb88);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                 *)in_stack_fffffffffffffb90,
                                (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                 *)in_stack_fffffffffffffb88), bVar3) {
        piVar14 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                  ::operator*(&local_2d0);
        local_2dc = *piVar14;
        HighsImplications::cleanupVarbounds
                  ((HighsImplications *)in_stack_fffffffffffffc50,
                   (HighsInt)((ulong)in_stack_fffffffffffffc48 >> 0x20));
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_2d0);
      }
      HighsDomain::clearChangedCols
                ((HighsDomain *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      HighsLpRelaxation::getLpSolver((HighsLpRelaxation *)(in_RDI + 0xd9));
      paVar24 = &local_301;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_300,"presolve",paVar24);
      Highs::setOptionValue
                (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      std::__cxx11::string::~string(local_300);
      std::allocator<char>::~allocator((allocator<char> *)&local_301);
      HighsLpRelaxation::getLpSolver((HighsLpRelaxation *)(in_RDI + 0xd9));
      paVar24 = &local_329;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_328,"simplex_initial_condition_check",paVar24);
      Highs::setOptionValue
                ((Highs *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 (string *)in_stack_fffffffffffffb90,
                 SUB81((ulong)in_stack_fffffffffffffb88 >> 0x38,0));
      std::__cxx11::string::~string(local_328);
      std::allocator<char>::~allocator((allocator<char> *)&local_329);
      checkObjIntegrality(in_stack_fffffffffffffb90);
      std::vector<double,_std::allocator<double>_>::clear
                ((vector<double,_std::allocator<double>_> *)0x626028);
      std::vector<double,_std::allocator<double>_>::clear
                ((vector<double,_std::allocator<double>_> *)0x62603c);
      local_330 = 0;
      *(undefined4 *)((long)in_RDI + 0x66fc) = 0;
      local_334 = 0;
      while (iVar20 = local_334, HVar4 = HighsMipSolver::numCol((HighsMipSolver *)*in_RDI),
            iVar20 != HVar4) {
        HVar2 = HighsMipSolver::variableType
                          ((HighsMipSolver *)in_stack_fffffffffffffb90,
                           (HighsInt)((ulong)in_stack_fffffffffffffb88 >> 0x20));
        switch(HVar2) {
        case kContinuous:
          bVar3 = HighsDomain::isFixed
                            ((HighsDomain *)
                             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                             in_stack_fffffffffffffb9c);
          if (!bVar3) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                       (value_type_conflict2 *)
                       CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
          }
          break;
        case kInteger:
          bVar3 = HighsDomain::isFixed
                            ((HighsDomain *)
                             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                             in_stack_fffffffffffffb9c);
          if (bVar3) {
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd3),(long)local_334);
            dVar23 = fractionality<double>
                               ((double)in_stack_fffffffffffffb90,
                                (double *)in_stack_fffffffffffffb88);
            if ((double)in_RDI[0xcc4] <= dVar23 && dVar23 != (double)in_RDI[0xcc4]) {
              *(undefined4 *)(*in_RDI + 0x20) = 8;
              local_340 = (double)in_RDI[0xcf7];
              in_RDI[0xcf7] = 0x7ff0000000000000;
              local_341 = (double)in_RDI[0xcf7] != local_340;
              if (((*(byte *)(*in_RDI + 0xb0) & 1) == 0) && ((bool)local_341)) {
                updatePrimalDualIntegral
                          ((HighsMipSolverData *)
                           CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                           (double)in_stack_fffffffffffffc68,(double)this_03,
                           (double)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                           (double)in_stack_fffffffffffffc50,
                           SUB81((ulong)in_stack_fffffffffffffc48 >> 0x38,0),
                           SUB81((ulong)in_stack_fffffffffffffc48 >> 0x30,0));
              }
              HighsCDouble::HighsCDouble(&local_358,1.0);
              in_RDI[0xce0] = (long)local_358.hi;
              in_RDI[0xce1] = (long)local_358.lo;
              return;
            }
          }
          else {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                       (value_type_conflict2 *)
                       CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                       (value_type_conflict2 *)
                       CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
            local_360 = 1024.0;
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)
                                (*(long *)(*in_RDI + 0x10) + 0x38),(long)local_334);
            dVar23 = *pvVar9 + 1.0;
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)
                                (*(long *)(*in_RDI + 0x10) + 0x20),(long)local_334);
            local_368 = dVar23 - *pvVar9;
            pdVar11 = std::min<double>(&local_360,&local_368);
            dVar23 = log2(*pdVar11);
            dVar23 = ceil(dVar23);
            *(int *)((long)in_RDI + 0x66fc) = (int)dVar23 + *(int *)((long)in_RDI + 0x66fc);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)
                                (*(long *)(*in_RDI + 0x10) + 0x20),(long)local_334);
            uVar17 = (uint)(*pvVar9 == 0.0);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)
                                (*(long *)(*in_RDI + 0x10) + 0x38),(long)local_334);
            local_330 = (uVar17 & *pvVar9 == 1.0) + local_330;
          }
          break;
        case kSemiContinuous:
        case kSemiInteger:
          highsLogUser((HighsLogOptions *)(*(long *)(*in_RDI + 8) + 0x380),kError,
                       "Semicontinuous or semiinteger variables should have been reformulated away before HighsMipSolverData::runSetup() is called."
                      );
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this_00,"Unexpected variable type");
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        case kImplicitInteger:
          bVar3 = HighsDomain::isFixed
                            ((HighsDomain *)
                             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                             in_stack_fffffffffffffb9c);
          if (!bVar3) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                       (value_type_conflict2 *)
                       CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                       (value_type_conflict2 *)
                       CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
          }
        }
        local_334 = local_334 + 1;
      }
      basisTransfer((HighsMipSolverData *)
                    CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
      uVar22 = (undefined4)((ulong)in_stack_fffffffffffffb90 >> 0x20);
      uVar21 = (undefined4)((ulong)in_stack_fffffffffffffb88 >> 0x20);
      sVar15 = std::vector<int,_std::allocator<int>_>::size
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc9b));
      *(int *)(in_RDI + 0xcdf) = (int)sVar15;
      *(bool *)(in_RDI + 0xc83) = (*(byte *)(in_RDI + 0xc83) & 1) != 0 && 0 < (int)local_330;
      HVar4 = HighsCliqueTable::getNumEntries((HighsCliqueTable *)(in_RDI + 0xb7d));
      *(HighsInt *)((long)in_RDI + 0x6424) = HVar4;
      if (*(int *)((long)in_RDI + 0x641c) == 0) {
        HVar4 = HighsCliqueTable::getNumEntries((HighsCliqueTable *)(in_RDI + 0xb7d));
        *(HighsInt *)(in_RDI + 0xc85) = HVar4;
        lVar1 = *(long *)(*in_RDI + 8);
        uVar5 = HighsMipSolver::numRow((HighsMipSolver *)*in_RDI);
        uVar6 = HighsMipSolver::numCol((HighsMipSolver *)*in_RDI);
        uVar17 = local_330;
        iVar20 = (int)in_RDI[0xcdf] - local_330;
        sVar15 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc9e));
        sVar16 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xca4));
        uVar7 = (undefined4)sVar16;
        HVar4 = HighsMipSolver::numNonzero((HighsMipSolver *)0x6266b6);
        this_02 = (HighsSymmetries *)CONCAT44(uVar22,(int)sVar15);
        highsLogUser((HighsLogOptions *)(lVar1 + 0x380),kInfo,
                     "\nSolving MIP model with:\n   %d rows\n   %d cols (%d binary, %d integer, %d implied int., %d continuous)\n   %d nonzeros\n"
                     ,(ulong)uVar5,(ulong)uVar6,(ulong)uVar17,CONCAT44(uVar21,iVar20),this_02,uVar7)
        ;
      }
      else {
        log_options_ = (HighsLogOptions *)(*(long *)(*in_RDI + 8) + 0x380);
        uVar5 = HighsMipSolver::numRow((HighsMipSolver *)*in_RDI);
        uVar6 = HighsMipSolver::numCol((HighsMipSolver *)*in_RDI);
        iVar20 = (int)in_RDI[0xcdf] - local_330;
        uVar17 = local_330;
        sVar15 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc9e));
        uVar7 = (undefined4)sVar15;
        sVar15 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xca4));
        uVar18 = (undefined4)sVar15;
        HVar4 = HighsMipSolver::numNonzero((HighsMipSolver *)0x626794);
        this_02 = (HighsSymmetries *)CONCAT44(uVar22,uVar7);
        highsLogUser(log_options_,kInfo,
                     "Model after restart has %d rows, %d cols (%d bin., %d int., %d impl., %d cont.), and %d nonzeros\n"
                     ,(ulong)uVar5,(ulong)uVar6,(ulong)uVar17,CONCAT44(uVar21,iVar20),this_02,uVar18
                    );
      }
      HighsPrimalHeuristics::setupIntCols
                ((HighsPrimalHeuristics *)CONCAT44(in_stack_fffffffffffffba4,HVar4));
      if (((double)in_RDI[0xcf9] == INFINITY) && (!NAN((double)in_RDI[0xcf9]))) {
        *(undefined1 *)((long)in_RDI + 0x6412) = 0;
      }
      *(undefined4 *)((long)in_RDI + 0x6414) = 0;
      std::vector<double,_std::allocator<double>_>::clear
                ((vector<double,_std::allocator<double>_> *)0x626836);
      HighsSymmetries::clear(this_02);
      if (*(int *)((long)in_RDI + 0x641c) != 0) {
        highsLogUser((HighsLogOptions *)(*(long *)(*in_RDI + 8) + 0x380),kInfo,"\n");
      }
    }
  }
  return;
}

Assistant:

void HighsMipSolverData::runSetup() {
  const HighsLp& model = *mipsolver.model_;

  last_disptime = -kHighsInf;
  disptime = 0;

  // Transform the reference of the objective limit and lower/upper
  // bounds from the original model to the current model, undoing the
  // transformation done before restart so that the offset change due
  // to presolve is incorporated. Bound changes are transitory, so no
  // real gap change, and no update to P-D integral is necessary
  upper_limit -= mipsolver.model_->offset_;
  optimality_limit -= mipsolver.model_->offset_;

  lower_bound -= mipsolver.model_->offset_;
  upper_bound -= mipsolver.model_->offset_;

  if (mipsolver.solution_objective_ != kHighsInf) {
    incumbent = postSolveStack.getReducedPrimalSolution(mipsolver.solution_);
    // return the objective value in the transformed space
    double solobj =
        mipsolver.solution_objective_ * (int)mipsolver.orig_model_->sense_ -
        mipsolver.model_->offset_;
    bool feasible = mipsolver.bound_violation_ <=
                        mipsolver.options_mip_->mip_feasibility_tolerance &&
                    mipsolver.integrality_violation_ <=
                        mipsolver.options_mip_->mip_feasibility_tolerance &&
                    mipsolver.row_violation_ <=
                        mipsolver.options_mip_->mip_feasibility_tolerance;
    if (numRestarts == 0) {
      highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                   "\nMIP start solution is %s, objective value is %.12g\n",
                   feasible ? "feasible" : "infeasible",
                   mipsolver.solution_objective_);
    }
    if (feasible && solobj < upper_bound) {
      double prev_upper_bound = upper_bound;

      upper_bound = solobj;

      bool bound_change = upper_bound != prev_upper_bound;
      if (!mipsolver.submip && bound_change)
        updatePrimalDualIntegral(lower_bound, lower_bound, prev_upper_bound,
                                 upper_bound);

      double new_upper_limit = computeNewUpperLimit(solobj, 0.0, 0.0);
      saveReportMipSolution(new_upper_limit);
      if (new_upper_limit < upper_limit) {
        upper_limit = new_upper_limit;
        optimality_limit =
            computeNewUpperLimit(solobj, mipsolver.options_mip_->mip_abs_gap,
                                 mipsolver.options_mip_->mip_rel_gap);
        nodequeue.setOptimalityLimit(optimality_limit);
      }
    }
    if (!mipsolver.submip && feasible && mipsolver.callback_->user_callback &&
        mipsolver.callback_->active[kCallbackMipSolution]) {
      assert(!mipsolver.submip);
      mipsolver.callback_->clearHighsCallbackDataOut();
      mipsolver.callback_->data_out.mip_solution = mipsolver.solution_.data();
      const bool interrupt = interruptFromCallbackWithData(
          kCallbackMipSolution, mipsolver.solution_objective_,
          "Feasible solution");
      assert(!interrupt);
    }
  }

  if (mipsolver.numCol() == 0)
    addIncumbent(std::vector<double>(), 0, kSolutionSourceEmptyMip);

  redcostfixing = HighsRedcostFixing();
  pseudocost = HighsPseudocost(mipsolver);
  nodequeue.setNumCol(mipsolver.numCol());
  nodequeue.setOptimalityLimit(optimality_limit);

  continuous_cols.clear();
  integer_cols.clear();
  implint_cols.clear();
  integral_cols.clear();

  rowMatrixSet = false;
  if (!rowMatrixSet) {
    rowMatrixSet = true;
    highsSparseTranspose(model.num_row_, model.num_col_, model.a_matrix_.start_,
                         model.a_matrix_.index_, model.a_matrix_.value_,
                         ARstart_, ARindex_, ARvalue_);
    // (re-)initialize number of uplocks and downlocks
    uplocks.assign(model.num_col_, 0);
    downlocks.assign(model.num_col_, 0);
    for (HighsInt i = 0; i != model.num_col_; ++i) {
      HighsInt start = model.a_matrix_.start_[i];
      HighsInt end = model.a_matrix_.start_[i + 1];
      for (HighsInt j = start; j != end; ++j) {
        HighsInt row = model.a_matrix_.index_[j];

        if (model.row_lower_[row] != -kHighsInf) {
          if (model.a_matrix_.value_[j] < 0)
            ++uplocks[i];
          else
            ++downlocks[i];
        }
        if (model.row_upper_[row] != kHighsInf) {
          if (model.a_matrix_.value_[j] < 0)
            ++downlocks[i];
          else
            ++uplocks[i];
        }
      }
    }
  }

  rowintegral.resize(mipsolver.model_->num_row_);

  // compute the maximal absolute coefficients to filter propagation
  maxAbsRowCoef.resize(mipsolver.model_->num_row_);
  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    double maxabsval = 0.0;

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];
    bool integral = true;
    for (HighsInt j = start; j != end; ++j) {
      integral =
          integral &&
          mipsolver.variableType(ARindex_[j]) != HighsVarType::kContinuous &&
          fractionality(ARvalue_[j]) <= epsilon;

      maxabsval = std::max(maxabsval, std::abs(ARvalue_[j]));
    }

    if (integral) {
      if (presolvedModel.row_lower_[i] != -kHighsInf)
        presolvedModel.row_lower_[i] =
            std::ceil(presolvedModel.row_lower_[i] - feastol);

      if (presolvedModel.row_upper_[i] != kHighsInf)
        presolvedModel.row_upper_[i] =
            std::floor(presolvedModel.row_upper_[i] + feastol);
    }

    rowintegral[i] = integral;
    maxAbsRowCoef[i] = maxabsval;
  }

  // compute row activities and propagate all rows once
  objectiveFunction.setupCliquePartition(domain, cliquetable);
  domain.setupObjectivePropagation();
  domain.computeRowActivities();
  domain.propagate();
  if (domain.infeasible()) {
    mipsolver.modelstatus_ = HighsModelStatus::kInfeasible;

    double prev_lower_bound = lower_bound;

    lower_bound = kHighsInf;

    bool bound_change = lower_bound != prev_lower_bound;
    if (!mipsolver.submip && bound_change)
      updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                               upper_bound);

    pruned_treeweight = 1.0;
    return;
  }

  if (model.num_col_ == 0) {
    mipsolver.modelstatus_ = HighsModelStatus::kOptimal;
    return;
  }

  if (checkLimits()) return;
  // extract cliques if they have not been extracted before

  for (HighsInt col : domain.getChangedCols())
    implications.cleanupVarbounds(col);
  domain.clearChangedCols();

  lp.getLpSolver().setOptionValue("presolve", kHighsOffString);
  // lp.getLpSolver().setOptionValue("dual_simplex_cost_perturbation_multiplier",
  // 0.0); lp.getLpSolver().setOptionValue("parallel", kHighsOnString);
  lp.getLpSolver().setOptionValue("simplex_initial_condition_check", false);

  checkObjIntegrality();
  rootlpsol.clear();
  firstlpsol.clear();
  HighsInt numBin = 0;

  maxTreeSizeLog2 = 0;
  for (HighsInt i = 0; i != mipsolver.numCol(); ++i) {
    switch (mipsolver.variableType(i)) {
      case HighsVarType::kContinuous:
        if (domain.isFixed(i)) continue;
        continuous_cols.push_back(i);
        break;
      case HighsVarType::kImplicitInteger:
        if (domain.isFixed(i)) continue;
        implint_cols.push_back(i);
        integral_cols.push_back(i);
        break;
      case HighsVarType::kInteger:
        if (domain.isFixed(i)) {
          if (fractionality(domain.col_lower_[i]) > feastol) {
            // integer variable is fixed to a fractional value -> infeasible
            mipsolver.modelstatus_ = HighsModelStatus::kInfeasible;

            double prev_lower_bound = lower_bound;

            lower_bound = kHighsInf;

            bool bound_change = lower_bound != prev_lower_bound;
            if (!mipsolver.submip && bound_change)
              updatePrimalDualIntegral(prev_lower_bound, lower_bound,
                                       upper_bound, upper_bound);

            pruned_treeweight = 1.0;
            return;
          }
          continue;
        }
        integer_cols.push_back(i);
        integral_cols.push_back(i);
        maxTreeSizeLog2 += (HighsInt)std::ceil(
            std::log2(std::min(1024.0, 1.0 + mipsolver.model_->col_upper_[i] -
                                           mipsolver.model_->col_lower_[i])));
        // NB Since this is for counting the number of times the
        // condition is true using the bitwise operator avoids having
        // any conditional branch whereas using the logical operator
        // would require a branch due to short circuit
        // evaluation. Semantically both is equivalent and correct. If
        // there was any code to be executed for the condition being
        // true then there would be a conditional branch in any case
        // and I would have used the logical to begin with.
        //
        // Hence any compiler warning can be ignored safely
        numBin +=
            (static_cast<HighsInt>(mipsolver.model_->col_lower_[i] == 0.0) &
             static_cast<HighsInt>(mipsolver.model_->col_upper_[i] == 1.0));
        break;
      case HighsVarType::kSemiContinuous:
      case HighsVarType::kSemiInteger:
        highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kError,
                     "Semicontinuous or semiinteger variables should have been "
                     "reformulated away before HighsMipSolverData::runSetup() "
                     "is called.");
        throw std::logic_error("Unexpected variable type");
    }
  }

  basisTransfer();

  numintegercols = integer_cols.size();
  detectSymmetries = detectSymmetries && numBin > 0;
  numCliqueEntriesAfterPresolve = cliquetable.getNumEntries();

  if (numRestarts == 0) {
    numCliqueEntriesAfterFirstPresolve = cliquetable.getNumEntries();
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 // clang-format off
               "\nSolving MIP model with:\n"
               "   %" HIGHSINT_FORMAT " rows\n"
               "   %" HIGHSINT_FORMAT " cols (%" HIGHSINT_FORMAT" binary, %" HIGHSINT_FORMAT " integer, %" HIGHSINT_FORMAT" implied int., %" HIGHSINT_FORMAT " continuous)\n"
               "   %" HIGHSINT_FORMAT " nonzeros\n",
                 // clang-format on
                 mipsolver.numRow(), mipsolver.numCol(), numBin,
                 numintegercols - numBin, (HighsInt)implint_cols.size(),
                 (HighsInt)continuous_cols.size(), mipsolver.numNonzero());
  } else {
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "Model after restart has %" HIGHSINT_FORMAT
                 " rows, %" HIGHSINT_FORMAT " cols (%" HIGHSINT_FORMAT
                 " bin., %" HIGHSINT_FORMAT " int., %" HIGHSINT_FORMAT
                 " impl., %" HIGHSINT_FORMAT " cont.), and %" HIGHSINT_FORMAT
                 " nonzeros\n",
                 mipsolver.numRow(), mipsolver.numCol(), numBin,
                 numintegercols - numBin, (HighsInt)implint_cols.size(),
                 (HighsInt)continuous_cols.size(), mipsolver.numNonzero());
  }

  heuristics.setupIntCols();

#ifdef HIGHS_DEBUGSOL
  if (numRestarts == 0) {
    debugSolution.activate();
    assert(!debugSolution.debugSolActive ||
           checkSolution(debugSolution.debugSolution));
  }
#endif

  if (upper_limit == kHighsInf) analyticCenterComputed = false;
  analyticCenterStatus = HighsModelStatus::kNotset;
  analyticCenter.clear();

  symmetries.clear();

  if (numRestarts != 0)
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "\n");
}